

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Optional<unsigned_long> __thiscall
llvm::DWARFUnit::getStringOffsetSectionItem(DWARFUnit *this,uint32_t Index)

{
  bool bVar1;
  byte bVar2;
  uint Size;
  uint64_t uVar3;
  size_t sVar4;
  DWARFObject *Obj;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  Optional<unsigned_long> OVar6;
  uint64_t local_60;
  undefined1 local_58 [8];
  DWARFDataExtractor DA;
  uint64_t Offset;
  uint ItemSize;
  uint32_t Index_local;
  DWARFUnit *this_local;
  bool local_10;
  
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this->StringOffsetsTableContribution);
  if (bVar1) {
    bVar2 = getDwarfStringOffsetsByteSize(this);
    Size = (uint)bVar2;
    uVar3 = getStringOffsetsBase(this);
    DA.Section = (DWARFSection *)(uVar3 + Index * Size);
    sVar4 = StringRef::size(&this->StringOffsetSection->Data);
    if (sVar4 < (long)&((DA.Section)->Data).Data + (ulong)Size) {
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,None);
      uVar5 = extraout_RDX_00;
    }
    else {
      Obj = DWARFContext::getDWARFObj(this->Context);
      DWARFDataExtractor::DWARFDataExtractor
                ((DWARFDataExtractor *)local_58,Obj,this->StringOffsetSection,
                 (bool)(this->isLittleEndian & 1),'\0');
      local_60 = DWARFDataExtractor::getRelocatedValue
                           ((DWARFDataExtractor *)local_58,Size,(uint64_t *)&DA.Section,
                            (uint64_t *)0x0,(Error *)0x0);
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,&local_60);
      uVar5 = extraout_RDX_01;
    }
  }
  else {
    Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,None);
    uVar5 = extraout_RDX;
  }
  OVar6.Storage._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  OVar6.Storage.hasVal = local_10;
  OVar6.Storage.field_0 =
       (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local;
  return (Optional<unsigned_long>)OVar6.Storage;
}

Assistant:

Optional<uint64_t> DWARFUnit::getStringOffsetSectionItem(uint32_t Index) const {
  if (!StringOffsetsTableContribution)
    return None;
  unsigned ItemSize = getDwarfStringOffsetsByteSize();
  uint64_t Offset = getStringOffsetsBase() + Index * ItemSize;
  if (StringOffsetSection.Data.size() < Offset + ItemSize)
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  return DA.getRelocatedValue(ItemSize, &Offset);
}